

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void activate_in_columns(ecs_world_t *world,ecs_query_t *query,ecs_map_t *component_map,
                        _Bool activate)

{
  ecs_entity_t *peVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  ecs_on_demand_in_t *peVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint local_48;
  
  pvVar4 = _ecs_vector_first((query->sig).columns,0x28,0x10);
  uVar2 = ecs_vector_count((query->sig).columns);
  if (0 < (int)uVar2) {
    uVar7 = activate - 1 | 1;
    uVar9 = 0;
    do {
      if (*(int *)((long)pvVar4 + uVar9 * 0x28 + 8) == 1) {
        peVar5 = get_in_component(component_map,
                                  *(ecs_entity_t *)((long)pvVar4 + uVar9 * 0x28 + 0x10));
        _ecs_assert(true,0xc,(char *)0x0,"in != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0x32);
        iVar8 = peVar5->count + uVar7;
        peVar5->count = iVar8;
        _ecs_assert((_Bool)((byte)~(byte)((uint)iVar8 >> 0x18) >> 7),0xc,(char *)0x0,
                    "in->count >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0x36);
        if (peVar5->count < 0) {
          __assert_fail("in->count >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                        ,0x36,
                        "void activate_in_columns(ecs_world_t *, ecs_query_t *, ecs_map_t *, _Bool)"
                       );
        }
        local_48 = (uint)activate;
        if (peVar5->count == local_48 && peVar5->systems != (ecs_vector_t *)0x0) {
          pvVar6 = _ecs_vector_first(peVar5->systems,8,0x10);
          uVar3 = ecs_vector_count(peVar5->systems);
          if (0 < (int)uVar3) {
            uVar10 = 0;
            do {
              peVar1 = *(ecs_entity_t **)((long)pvVar6 + uVar10 * 8);
              iVar8 = (int)peVar1[1] + uVar7;
              *(int *)(peVar1 + 1) = iVar8;
              if (activate) {
                if (iVar8 == 1) {
                  ecs_remove_entity(world,*peVar1,0x104);
                }
                else if (!activate) goto LAB_0012fa22;
              }
              else {
LAB_0012fa22:
                if (iVar8 == 0) {
                  ecs_add_entity(world,*peVar1,0x104);
                }
              }
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2);
  }
  return;
}

Assistant:

static
void activate_in_columns(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_map_t *component_map,
    bool activate)
{
    ecs_sig_column_t *columns = ecs_vector_first(query->sig.columns, ecs_sig_column_t);
    int32_t i, count = ecs_vector_count(query->sig.columns);

    for (i = 0; i < count; i ++) {
        if (columns[i].inout_kind == EcsIn) {
            ecs_on_demand_in_t *in = get_in_component(
                component_map, columns[i].is.component);
            ecs_assert(in != NULL, ECS_INTERNAL_ERROR, NULL);

            in->count += activate ? 1 : -1;

            ecs_assert(in->count >= 0, ECS_INTERNAL_ERROR, NULL);

            /* If this is the first system that registers the in component, walk
             * over all already registered systems to enable them */
            if (in->systems && 
               ((activate && in->count == 1) || 
                (!activate && !in->count))) 
            {
                ecs_on_demand_out_t **out = ecs_vector_first(
                    in->systems, ecs_on_demand_out_t*);
                int32_t s, in_count = ecs_vector_count(in->systems);

                for (s = 0; s < in_count; s ++) {
                    /* Increase the count of the system with the out params */
                    out[s]->count += activate ? 1 : -1;
                    
                    /* If this is the first out column that is requested from
                     * the OnDemand system, enable it */
                    if (activate && out[s]->count == 1) {
                        ecs_remove_entity(world, out[s]->system, EcsDisabledIntern);
                    } else if (!activate && !out[s]->count) {
                        ecs_add_entity(world, out[s]->system, EcsDisabledIntern);             
                    }
                }
            }
        }
    }    
}